

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

Metadata *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::Metadata>(Arena *arena)

{
  Metadata *this;
  
  if (arena == (Arena *)0x0) {
    this = (Metadata *)operator_new(0x68);
    CoreML::Specification::Metadata::Metadata(this,(Arena *)0x0,false);
  }
  else {
    this = (Metadata *)
           AllocateAlignedWithHook
                     (arena,0x68,(type_info *)&CoreML::Specification::Metadata::typeinfo);
    CoreML::Specification::Metadata::Metadata(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }